

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O1

void handle_signal(int signal_id,SIGFUNC sigfunc,sigaction *previousAction,int additionalFlags)

{
  uint __errnum;
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  _union_1457 local_b0;
  sigset_t local_a8;
  uint local_28;
  
  local_28 = additionalFlags | 0x10000004;
  local_b0 = (_union_1457)sigfunc;
  sigemptyset(&local_a8);
  iVar1 = sigaction(signal_id,(sigaction *)&local_b0,(sigaction *)previousAction);
  if (iVar1 == -1) {
    fprintf(_stderr,"] %s %s:%d","handle_signal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/exception/signal.cpp"
            ,0x243);
    __stream = _stderr;
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    fprintf(__stream,"handle_signal: sigaction() call failed with error code %d (%s)\n",
            (ulong)__errnum,pcVar3);
  }
  return;
}

Assistant:

void handle_signal(int signal_id, SIGFUNC sigfunc, struct sigaction *previousAction, int additionalFlags)
{
    struct sigaction newAction;

    newAction.sa_flags = SA_RESTART | additionalFlags;
#if HAVE_SIGINFO_T
    newAction.sa_handler = NULL;
    newAction.sa_sigaction = sigfunc;
    newAction.sa_flags |= SA_SIGINFO;
#else   /* HAVE_SIGINFO_T */
    newAction.sa_handler = SIG_DFL;
#endif  /* HAVE_SIGINFO_T */
    sigemptyset(&newAction.sa_mask);

    if (-1 == sigaction(signal_id, &newAction, previousAction))
    {
        ASSERT("handle_signal: sigaction() call failed with error code %d (%s)\n",
            errno, strerror(errno));
    }
}